

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
Operation<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
          (ArgMinMaxBase<duckdb::GreaterThan,false> *this,
          ArgMinMaxState<double,_duckdb::string_t> *state,double *x,string_t *y,
          AggregateBinaryInput *binary)

{
  long lVar1;
  ArgMinMaxBase<duckdb::GreaterThan,false> AVar2;
  string_t y_data;
  string_t new_value;
  
  if (*this != (ArgMinMaxBase<duckdb::GreaterThan,false>)0x0) {
    y_data.value.pointer.ptr = (char *)y;
    y_data.value._0_8_ = x[1];
    Execute<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>>
              (this,(ArgMinMaxState<double,_duckdb::string_t> *)*x,*(double *)state,y_data,binary);
    return;
  }
  if ((**(long **)&y[1].value != 0) &&
     ((*(ulong *)(**(long **)&y[1].value + (*(ulong *)&y[2].value >> 6) * 8) >>
       (*(ulong *)&y[2].value & 0x3f) & 1) == 0)) {
    return;
  }
  lVar1 = *(long *)(y->value).pointer.ptr;
  if (lVar1 == 0) {
    this[1] = (ArgMinMaxBase<duckdb::GreaterThan,false>)0x0;
  }
  else {
    y = (string_t *)y[1].value.pointer.ptr;
    AVar2 = (ArgMinMaxBase<duckdb::GreaterThan,false>)
            ((*(ulong *)(lVar1 + ((ulong)y >> 6) * 8) >> ((ulong)y & 0x3f) & 1) == 0);
    this[1] = AVar2;
    if ((bool)AVar2) goto LAB_019e126c;
  }
  *(undefined8 *)(this + 8) = *(undefined8 *)state;
LAB_019e126c:
  new_value.value.pointer.ptr = (char *)y;
  new_value.value._0_8_ = x[1];
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)(this + 0x10),(string_t *)*x,new_value);
  *this = (ArgMinMaxBase<duckdb::GreaterThan,false>)0x1;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}